

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

bool pdqsort_detail::
     partial_insertion_sort<__gnu_cxx::__normal_iterator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>*,std::vector<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>,std::allocator<std::tuple<int,std::vector<std::pair<HighsCliqueTable::CliqueVar,double>,std::allocator<std::pair<HighsCliqueTable::CliqueVar,double>>>,double,int>>>>,presolve::HPresolve::liftingForProbing(presolve::HighsPostsolveStack&)::__4>
               (__normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
                begin,__normal_iterator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_*,_std::vector<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>,_std::allocator<std::tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>_>_>_>
                      end,anon_class_8_1_d757357c comp)

{
  bool bVar1;
  long lVar2;
  tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
  *ptVar3;
  long lVar4;
  tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
  *this;
  long lVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  double dVar11;
  int iVar13;
  undefined1 auVar12 [16];
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  T tmp;
  tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
  local_78;
  tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
  *local_40;
  tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
  *local_38;
  
  if (begin._M_current != end._M_current) {
    ptVar3 = begin._M_current + 1;
    if (ptVar3 != end._M_current) {
      lVar5 = 0;
      uVar6 = 0;
      local_40 = begin._M_current;
      local_38 = end._M_current;
      do {
        local_78.
        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .
        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>._M_head_impl =
             begin._M_current[1].
             super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             .
             super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             .super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>._M_head_impl;
        local_78.
        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .
        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .
        super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
        ._M_head_impl.
        super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             *(pointer *)
              ((long)&begin._M_current[1].
                      super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      .
                      super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                      .
                      super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                      ._M_head_impl.
                      super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                      ._M_impl.super__Vector_impl_data + 8);
        local_78.
        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .
        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .
        super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
        ._M_head_impl.
        super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             begin._M_current[1].
             super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             .
             super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             .
             super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
             ._M_head_impl.
             super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_78.
        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .
        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .super__Tuple_impl<2UL,_double,_int>.super__Tuple_impl<3UL,_int>.
        super__Head_base<3UL,_int,_false>._M_head_impl =
             (_Head_base<3UL,_int,_false>)
             (ptVar3->
             super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             ).
             super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             .super__Tuple_impl<2UL,_double,_int>.super__Tuple_impl<3UL,_int>.
             super__Head_base<3UL,_int,_false>._M_head_impl;
        iVar10 = (int)((ulong)((long)local_78.
                                     super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                     .
                                     super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                     .
                                     super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                     ._M_head_impl.
                                     super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_78.
                                    super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                    .
                                    super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                    .
                                    super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                    ._M_head_impl.
                                    super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4);
        iVar13 = (int)((ulong)((long)*(pointer *)
                                      ((long)&((begin._M_current)->
                                              super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                              ).
                                              super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                              .
                                              super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                              ._M_head_impl.
                                              super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                              ._M_impl.super__Vector_impl_data + 8) -
                              (long)((begin._M_current)->
                                    super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                    ).
                                    super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                    .
                                    super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                    ._M_head_impl.
                                    super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4);
        auVar12._8_8_ =
             ((begin._M_current)->
             super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             ).
             super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             .super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>._M_head_impl;
        auVar12._0_8_ =
             local_78.
             super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             .
             super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             .super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>._M_head_impl;
        auVar15._8_8_ = *(comp.computeOverallScore)->bestscoretotal;
        auVar15._0_8_ = *(comp.computeOverallScore)->bestscoretotal;
        auVar12 = divpd(auVar12,auVar15);
        auVar16._0_8_ = (double)iVar10;
        auVar16._8_8_ = (double)iVar13;
        auVar8._0_8_ = (double)(iVar10 - (int)local_78.
                                              super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                              .
                                              super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                              .super__Tuple_impl<2UL,_double,_int>.
                                              super__Tuple_impl<3UL,_int>.
                                              super__Head_base<3UL,_int,_false>._M_head_impl) * 0.5;
        auVar8._8_8_ = (double)(iVar13 - ((begin._M_current)->
                                         super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                         ).
                                         super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                         .super__Tuple_impl<2UL,_double,_int>.
                                         super__Tuple_impl<3UL,_int>.
                                         super__Head_base<3UL,_int,_false>._M_head_impl) * 0.5;
        auVar8 = divpd(auVar8,auVar16);
        dVar11 = auVar12._0_8_ * 0.5 + auVar8._0_8_;
        dVar14 = auVar12._8_8_ * 0.5 + auVar8._8_8_;
        local_78.
        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
        .super__Head_base<0UL,_int,_false>._M_head_impl =
             begin._M_current[1].
             super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
             .super__Head_base<0UL,_int,_false>._M_head_impl;
        bVar1 = local_78.
                super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                .super__Head_base<0UL,_int,_false>._M_head_impl <
                ((begin._M_current)->
                super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                ).super__Head_base<0UL,_int,_false>._M_head_impl;
        if (dVar11 != dVar14) {
          bVar1 = dVar14 < dVar11;
        }
        if (NAN(dVar11) || NAN(dVar14)) {
          bVar1 = dVar14 < dVar11;
        }
        if (bVar1) {
          local_78.
          super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
          .
          super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
          .
          super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
          ._M_head_impl.
          super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               *(pointer *)
                ((long)&begin._M_current[1].
                        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                        .
                        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                        .
                        super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                        ._M_head_impl.
                        super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                        ._M_impl.super__Vector_impl_data + 0x10);
          begin._M_current[1].
          super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
          .
          super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
          .
          super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
          ._M_head_impl.
          super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          *(pointer *)
           ((long)&begin._M_current[1].
                   super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                   .
                   super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                   .
                   super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                   ._M_head_impl.
                   super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                   ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
          *(pointer *)
           ((long)&begin._M_current[1].
                   super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                   .
                   super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                   .
                   super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                   ._M_head_impl.
                   super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                   ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
          lVar2 = 0;
          do {
            lVar4 = lVar2;
            std::
            tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
            ::operator=((tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                         *)((long)&(ptVar3->
                                   super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                   ).
                                   super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                   .super__Tuple_impl<2UL,_double,_int>.super__Tuple_impl<3UL,_int>.
                                   super__Head_base<3UL,_int,_false>._M_head_impl + lVar4),
                        (type)((long)&((begin._M_current)->
                                      super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                      ).
                                      super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                      .super__Tuple_impl<2UL,_double,_int>.
                                      super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>.
                                      _M_head_impl + lVar4));
            this = local_40;
            if (lVar5 == lVar4) goto LAB_0031c588;
            iVar10 = (int)((ulong)((long)local_78.
                                         super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                         .
                                         super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                         .
                                         super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                         ._M_head_impl.
                                         super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_78.
                                        super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                        .
                                        super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                        .
                                        super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                                        ._M_head_impl.
                                        super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4);
            iVar13 = (int)((ulong)(*(long *)((long)begin._M_current + lVar4 + -0x18) -
                                  *(long *)((long)begin._M_current + lVar4 + -0x20)) >> 4);
            auVar7._8_8_ = *(undefined8 *)((long)begin._M_current + lVar4 + -0x28);
            auVar7._0_8_ = local_78.
                           super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                           .
                           super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                           .super__Tuple_impl<2UL,_double,_int>.super__Head_base<2UL,_double,_false>
                           ._M_head_impl;
            auVar17._8_8_ = *(comp.computeOverallScore)->bestscoretotal;
            auVar17._0_8_ = *(comp.computeOverallScore)->bestscoretotal;
            auVar8 = divpd(auVar7,auVar17);
            auVar18._0_8_ = (double)iVar10;
            auVar18._8_8_ = (double)iVar13;
            auVar9._0_8_ = (double)(iVar10 - (int)local_78.
                                                  super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                  .
                                                  super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                  .super__Tuple_impl<2UL,_double,_int>.
                                                  super__Tuple_impl<3UL,_int>.
                                                  super__Head_base<3UL,_int,_false>._M_head_impl) *
                           0.5;
            auVar9._8_8_ = (double)(iVar13 - *(int *)((long)&begin._M_current[-1].
                                                                                                                          
                                                  super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                  .
                                                  super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                                                  .super__Tuple_impl<2UL,_double,_int>.
                                                  super__Tuple_impl<3UL,_int>.
                                                  super__Head_base<3UL,_int,_false>._M_head_impl +
                                                  lVar4)) * 0.5;
            auVar12 = divpd(auVar9,auVar18);
            dVar11 = auVar8._0_8_ * 0.5 + auVar12._0_8_;
            dVar14 = auVar8._8_8_ * 0.5 + auVar12._8_8_;
            bVar1 = local_78.
                    super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                    .super__Head_base<0UL,_int,_false>._M_head_impl <
                    *(int *)((long)begin._M_current + lVar4 + -8);
            if (dVar11 != dVar14) {
              bVar1 = dVar14 < dVar11;
            }
            if (NAN(dVar11) || NAN(dVar14)) {
              bVar1 = dVar14 < dVar11;
            }
            lVar2 = lVar4 + -0x30;
          } while (bVar1);
          this = (tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                  *)((long)&ptVar3[-1].
                            super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                            .
                            super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                            .super__Tuple_impl<2UL,_double,_int>.super__Tuple_impl<3UL,_int>.
                            super__Head_base<3UL,_int,_false>._M_head_impl + lVar4);
LAB_0031c588:
          std::
          tuple<int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
          ::operator=(this,&local_78);
          if (local_78.
              super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              .
              super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
              .
              super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
              ._M_head_impl.
              super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_78.
                            super__Tuple_impl<0UL,_int,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                            .
                            super__Tuple_impl<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_double,_int>
                            .
                            super__Head_base<1UL,_std::vector<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>,_false>
                            ._M_head_impl.
                            super__Vector_base<std::pair<HighsCliqueTable::CliqueVar,_double>,_std::allocator<std::pair<HighsCliqueTable::CliqueVar,_double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          uVar6 = uVar6 + ((long)ptVar3 - (long)this >> 4) * -0x5555555555555555;
          end._M_current = local_38;
          if (8 < uVar6) {
            return false;
          }
        }
        ptVar3 = ptVar3 + 1;
        lVar5 = lVar5 + -0x30;
        begin._M_current = begin._M_current + 1;
      } while (ptVar3 != end._M_current);
    }
  }
  return true;
}

Assistant:

inline bool partial_insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return true;
        
        std::size_t limit = 0;
        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (sift != begin && comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
                limit += cur - sift;
            }
            
            if (limit > partial_insertion_sort_limit) return false;
        }

        return true;
    }